

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::ROIAlign_x86_avx::forward
          (ROIAlign_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  long lVar3;
  int *piVar4;
  Mat *this_00;
  reference pvVar5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  size_type __n;
  long *in_RDI;
  float pooled_height;
  float pooled_width;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  PreCalc<float> *pc_1;
  int ix;
  int iy;
  float output_val;
  int pw_1;
  int ph_1;
  int pre_calc_index_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc_1;
  float count;
  int roi_bin_grid_w_1;
  int roi_bin_grid_h_1;
  PreCalc<float> *pc;
  int bx;
  int by;
  float sum;
  int area;
  bool is_empty;
  int bin_grid_w;
  int bin_grid_h;
  float wend;
  float hend;
  float wstart;
  float hstart;
  int pw;
  int ph;
  int pre_calc_index;
  float *outptr;
  float *ptr;
  int q;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  int roi_bin_grid_w;
  int roi_bin_grid_h;
  float bin_size_h;
  float bin_size_w;
  float roi_height;
  float roi_width;
  float roi_end_h;
  float roi_end_w;
  float roi_start_h;
  float roi_start_w;
  float *roi_ptr;
  Mat *top_blob;
  Mat *roi_blob;
  int channels;
  size_t elemsize;
  int height;
  int width;
  Mat *bottom_blob;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  size_t in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  size_type in_stack_fffffffffffffc98;
  Mat *in_stack_fffffffffffffca0;
  Mat *in_stack_fffffffffffffca8;
  float local_348;
  float local_344;
  float local_340;
  bool local_339;
  float local_334;
  float local_32c;
  undefined8 in_stack_fffffffffffffd10;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  undefined1 *puVar11;
  int in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  int iVar12;
  undefined4 in_stack_fffffffffffffd54;
  int iVar13;
  float local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  Mat local_298;
  float *local_250;
  Mat local_248;
  Mat *local_200;
  int local_1f8;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> local_1f0;
  int local_1d4;
  int local_1d0;
  float local_1cc;
  int local_1c8;
  int local_1c4;
  reference local_1c0;
  int local_1b8;
  int local_1b4;
  float local_1b0;
  int local_1ac;
  bool local_1a5;
  int local_1a4;
  int local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  int local_16c;
  int local_168;
  int local_164;
  Mat local_160;
  float *local_118;
  Mat local_110;
  float *local_c8;
  int local_c0;
  undefined1 local_a9;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> local_a8;
  int local_90;
  int local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float *local_60;
  reference local_58;
  const_reference local_50;
  int local_44;
  size_t local_40;
  int local_38;
  int local_34;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->w;
  local_38 = local_30->h;
  local_40 = local_30->elemsize;
  local_44 = local_30->c;
  local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_58 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  Mat::create(in_stack_fffffffffffffca0,(int)(in_stack_fffffffffffffc98 >> 0x20),
              (int)in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,in_stack_fffffffffffffc88,
              (Allocator *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_60 = Mat::operator_cast_to_float_(local_50);
    local_64 = *local_60 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    local_68 = local_60[1] * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    local_6c = local_60[2] * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    local_70 = local_60[3] * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) & 1) != 0) {
      local_64 = local_64 - 0.5;
      local_68 = local_68 - 0.5;
      local_6c = local_6c - 0.5;
      local_70 = local_70 - 0.5;
    }
    local_74 = local_6c - local_64;
    local_78 = local_70 - local_68;
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) & 1) == 0) {
      local_7c = 1.0;
      pfVar2 = std::max<float>(&local_74,&local_7c);
      local_74 = *pfVar2;
      local_80 = 1.0;
      pfVar2 = std::max<float>(&local_78,&local_80);
      local_78 = *pfVar2;
    }
    local_84 = local_74 / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    local_88 = local_78 / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
        auVar7._0_4_ = local_78 / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
        dVar6 = std::ceil(auVar7._0_8_);
        pooled_height = SUB84(dVar6,0);
      }
      else {
        pooled_height = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
      }
      iVar13 = (int)((ulong)in_stack_fffffffffffffd20 >> 0x20);
      local_8c = (int)pooled_height;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
        auVar8._0_4_ = local_74 / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
        dVar6 = std::ceil(auVar8._0_8_);
        pooled_width = SUB84(dVar6,0);
      }
      else {
        pooled_width = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
      }
      local_90 = (int)pooled_width;
      lVar3 = (long)local_8c * (long)local_90 *
              (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) *
              (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      puVar11 = &local_a9;
      std::allocator<ncnn::PreCalc<float>_>::allocator((allocator<ncnn::PreCalc<float>_> *)0x6f001b)
      ;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                ((vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *)
                 in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      std::allocator<ncnn::PreCalc<float>_>::~allocator
                ((allocator<ncnn::PreCalc<float>_> *)0x6f0047);
      original_pre_calc_for_bilinear_interpolate<float>
                ((int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)pooled_height,(int)pooled_width,
                 (float)((ulong)puVar11 >> 0x20),SUB84(puVar11,0),(float)((ulong)lVar3 >> 0x20),
                 (float)lVar3,iVar13,in_stack_fffffffffffffd18);
      for (local_c0 = 0; local_c0 < local_44; local_c0 = local_c0 + 1) {
        Mat::channel(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_110);
        Mat::~Mat((Mat *)0x6f0110);
        local_c8 = pfVar2;
        Mat::channel(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_160);
        Mat::~Mat((Mat *)0x6f0162);
        local_164 = 0;
        local_118 = pfVar2;
        for (local_168 = 0; local_168 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
            local_168 = local_168 + 1) {
          for (local_16c = 0; local_16c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
              ; local_16c = local_16c + 1) {
            local_170 = local_68 + (float)local_168 * local_88;
            local_174 = local_64 + (float)local_16c * local_84;
            local_178 = local_68 + (float)(local_168 + 1) * local_88;
            local_17c = local_64 + (float)(local_16c + 1) * local_84;
            local_180 = 0.0;
            pfVar2 = std::max<float>(&local_170,&local_180);
            local_184 = (float)local_38;
            pfVar2 = std::min<float>(pfVar2,&local_184);
            local_170 = *pfVar2;
            local_188 = 0.0;
            pfVar2 = std::max<float>(&local_174,&local_188);
            local_18c = (float)local_34;
            pfVar2 = std::min<float>(pfVar2,&local_18c);
            local_174 = *pfVar2;
            local_190 = 0.0;
            pfVar2 = std::max<float>(&local_178,&local_190);
            local_194 = (float)local_38;
            pfVar2 = std::min<float>(pfVar2,&local_194);
            local_178 = *pfVar2;
            local_198 = 0.0;
            pfVar2 = std::max<float>(&local_17c,&local_198);
            local_19c = (float)local_34;
            pfVar2 = std::min<float>(pfVar2,&local_19c);
            local_17c = *pfVar2;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
              dVar6 = std::ceil((double)(ulong)(uint)(local_178 - local_170));
              local_32c = SUB84(dVar6,0);
            }
            else {
              local_32c = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
            }
            local_1a0 = (int)local_32c;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
              dVar6 = std::ceil((double)(ulong)(uint)(local_17c - local_174));
              local_334 = SUB84(dVar6,0);
            }
            else {
              local_334 = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
            }
            local_1a4 = (int)local_334;
            local_339 = local_178 <= local_170 || local_17c <= local_174;
            local_1a5 = local_339;
            local_1ac = local_1a0 * local_1a4;
            local_1b0 = 0.0;
            for (local_1b4 = 0; local_1b4 < local_1a0; local_1b4 = local_1b4 + 1) {
              for (local_1b8 = 0; local_1b8 < local_1a4; local_1b8 = local_1b8 + 1) {
                __n = (size_type)local_164;
                local_164 = local_164 + 1;
                local_1c0 = std::
                            vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::
                            operator[](&local_a8,__n);
                local_1b0 = local_1c0->w1 * local_c8[local_1c0->pos1] +
                            local_1c0->w2 * local_c8[local_1c0->pos2] +
                            local_1c0->w3 * local_c8[local_1c0->pos3] +
                            local_1c0->w4 * local_c8[local_1c0->pos4] + local_1b0;
              }
            }
            if ((local_1a5 & 1U) == 0) {
              local_340 = local_1b0 / (float)local_1ac;
            }
            else {
              local_340 = 0.0;
            }
            local_118[local_16c] = local_340;
          }
          local_118 = local_118 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        }
      }
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::~vector
                ((vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    }
    else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
        auVar9._0_4_ = local_78 / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        auVar9._4_12_ = SUB6012((undefined1  [60])0x0,0);
        dVar6 = std::ceil(auVar9._0_8_);
        local_344 = SUB84(dVar6,0);
      }
      else {
        local_344 = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
      }
      local_1c4 = (int)local_344;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
        auVar10._0_4_ = local_74 / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
        ;
        auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
        dVar6 = std::ceil(auVar10._0_8_);
        local_348 = SUB84(dVar6,0);
      }
      else {
        local_348 = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
      }
      local_1c8 = (int)local_348;
      local_1d0 = local_1c4 * local_1c8;
      local_1d4 = 1;
      piVar4 = std::max<int>(&local_1d0,&local_1d4);
      local_1cc = (float)*piVar4;
      this_00 = (Mat *)((long)local_1c4 * (long)local_1c8 *
                        (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) *
                       (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4));
      std::allocator<ncnn::PreCalc<float>_>::allocator((allocator<ncnn::PreCalc<float>_> *)0x6f09fe)
      ;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                ((vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *)
                 in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      std::allocator<ncnn::PreCalc<float>_>::~allocator
                ((allocator<ncnn::PreCalc<float>_> *)0x6f0a24);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                ((int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(int)in_stack_fffffffffffffd30,
                 (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(int)in_stack_fffffffffffffd28,
                 (int)((ulong)in_stack_fffffffffffffd20 >> 0x20),(int)in_stack_fffffffffffffd20,
                 (float)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                 SUB84(in_stack_fffffffffffffd18,0),
                 (float)((ulong)in_stack_fffffffffffffd10 >> 0x20),(float)in_stack_fffffffffffffd10,
                 (int)in_RDI,in_stack_fffffffffffffd48,
                 (vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      for (local_1f8 = 0; local_1f8 < local_44; local_1f8 = local_1f8 + 1) {
        Mat::channel(this_00,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
        in_stack_fffffffffffffca0 = (Mat *)Mat::operator_cast_to_float_(&local_248);
        Mat::~Mat((Mat *)0x6f0afe);
        local_200 = in_stack_fffffffffffffca0;
        Mat::channel(this_00,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_298);
        Mat::~Mat((Mat *)0x6f0b4a);
        local_29c = 0;
        local_250 = pfVar2;
        for (local_2a0 = 0; local_2a0 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
            local_2a0 = local_2a0 + 1) {
          for (local_2a4 = 0; local_2a4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
              ; local_2a4 = local_2a4 + 1) {
            local_2a8 = 0.0;
            for (iVar13 = 0; iVar13 < local_1c4; iVar13 = iVar13 + 1) {
              for (iVar12 = 0; iVar12 < local_1c8; iVar12 = iVar12 + 1) {
                pvVar5 = std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::
                         operator[](&local_1f0,(long)local_29c);
                local_2a8 = pvVar5->w1 * *(float *)((long)&local_200->data + (long)pvVar5->pos1 * 4)
                            + pvVar5->w2 *
                              *(float *)((long)&local_200->data + (long)pvVar5->pos2 * 4) +
                            pvVar5->w3 * *(float *)((long)&local_200->data + (long)pvVar5->pos3 * 4)
                            + pvVar5->w4 *
                              *(float *)((long)&local_200->data + (long)pvVar5->pos4 * 4) +
                            local_2a8;
                local_29c = local_29c + 1;
              }
            }
            local_250[local_2a4] = local_2a8 / local_1cc;
          }
          local_250 = local_250 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        }
      }
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::~vector
                ((vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ROIAlign_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}